

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

size_t mpeg_bitstream_parse
                 (mpeg_bitstream_t *packet,caption_frame_t *frame,uint8_t *data,size_t size,
                 uint stream_type,double dts,double cts)

{
  size_t sVar1;
  sei_message_t *__ptr;
  byte bVar2;
  libcaption_stauts_t lVar3;
  libcaption_stauts_t lVar4;
  size_t __n;
  uint uVar5;
  libcaption_stauts_t lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  cea708_t *pcVar10;
  _sei_message_t *p_Var11;
  double timestamp;
  sei_t local_48;
  
  uVar9 = packet->size;
  if (uVar9 < 0x600000) {
    __n = 0x600000 - uVar9;
    if (uVar9 + size < 0x600000) {
      __n = size;
    }
    packet->status = LIBCAPTION_OK;
    memcpy(packet->data + uVar9,data,__n);
    uVar9 = packet->size + __n;
    packet->size = uVar9;
    if (packet->status == LIBCAPTION_OK) {
      uVar8 = 4;
      if (stream_type != 0x1b) {
        uVar8 = (ulong)(stream_type == 0x24) * 5;
      }
      timestamp = cts + dts;
      while (1 < uVar9) {
        uVar5 = 0xffffffff;
        lVar7 = 0;
        while (uVar5 << 8 != 0x100) {
          uVar5 = uVar5 << 8 | (uint)packet->data[lVar7 + 1];
          lVar7 = lVar7 + 1;
          if ((1 - uVar9) + lVar7 == 0) {
            return __n;
          }
        }
        if (lVar7 == 2) {
          return __n;
        }
        if (3 < uVar9) {
          if (stream_type == 0x24) {
            bVar2 = packet->data[3] >> 1 & 0x3f;
          }
          else if (stream_type == 0x1b) {
            bVar2 = packet->data[3] & 0x1f;
          }
          else {
            if (stream_type != 2) goto LAB_001079c4;
            bVar2 = packet->data[3];
          }
          if ((bVar2 == 6) || (bVar2 == 0x27)) {
            if (uVar8 < lVar7 - 2U && (stream_type == 0x24 || stream_type == 0x1b)) {
              lVar4 = sei_parse(&local_48,packet->data + uVar8,(-2 - uVar8) + lVar7,timestamp);
              __ptr = local_48.head;
              packet->status = lVar4;
              p_Var11 = local_48.head;
              if (local_48.head != (sei_message_t *)0x0) {
                do {
                  if (p_Var11->type == sei_type_user_data_registered_itu_t_t35) {
                    sVar1 = packet->latent;
                    packet->latent = sVar1 + 1;
                    pcVar10 = (cea708_t *)
                              ((long)(packet->cea708[0].user_data.cc_data + -5) +
                              (ulong)(((int)sVar1 + (int)packet->front & 0x3fU) * 0xa0));
                    cea708_init(pcVar10,timestamp);
                    lVar4 = packet->status;
                    lVar3 = cea708_parse_h264((uint8_t *)(p_Var11 + 1),p_Var11->size,pcVar10);
                    lVar6 = lVar3;
                    if (lVar4 == LIBCAPTION_READY) {
                      lVar6 = lVar4;
                    }
                    if (lVar3 == LIBCAPTION_ERROR) {
                      lVar6 = lVar3;
                    }
                    if (lVar4 == LIBCAPTION_ERROR) {
                      lVar6 = lVar4;
                    }
                    packet->status = lVar6;
                    _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
                  }
                  p_Var11 = p_Var11->next;
                } while (p_Var11 != (_sei_message_t *)0x0);
                while (__ptr != (sei_message_t *)0x0) {
                  p_Var11 = __ptr->next;
                  free(__ptr);
                  __ptr = p_Var11;
                }
              }
              local_48.timestamp = 0.0;
              local_48.head = (sei_message_t *)0x0;
              local_48.tail = (sei_message_t *)0x0;
            }
          }
          else if ((bVar2 == 0xb2) && (4 < lVar7 - 2U && stream_type == 2)) {
            sVar1 = packet->latent;
            packet->latent = sVar1 + 1;
            pcVar10 = (cea708_t *)
                      ((long)(packet->cea708[0].user_data.cc_data + -5) +
                      (ulong)(((int)sVar1 + (int)packet->front & 0x3fU) * 0xa0));
            cea708_init(pcVar10,timestamp);
            lVar4 = packet->status;
            lVar3 = cea708_parse_h262(packet->data + 4,lVar7 - 6,pcVar10);
            lVar6 = lVar3;
            if (lVar4 == LIBCAPTION_READY) {
              lVar6 = lVar4;
            }
            if (lVar3 == LIBCAPTION_ERROR) {
              lVar6 = lVar3;
            }
            if (lVar4 == LIBCAPTION_ERROR) {
              lVar6 = lVar4;
            }
            packet->status = lVar6;
            _mpeg_bitstream_cea708_sort_flush(packet,frame,dts);
          }
        }
LAB_001079c4:
        uVar9 = (packet->size - lVar7) + 2;
        packet->size = uVar9;
        memmove(packet->data,packet->data + lVar7 + -2,uVar9);
        if (packet->status != LIBCAPTION_OK) {
          return __n;
        }
      }
    }
  }
  else {
    packet->status = LIBCAPTION_ERROR;
    __n = 0;
  }
  return __n;
}

Assistant:

size_t mpeg_bitstream_parse(mpeg_bitstream_t* packet, caption_frame_t* frame, const uint8_t* data, size_t size, unsigned stream_type, double dts, double cts)
{
    if (MAX_NALU_SIZE <= packet->size) {
        packet->status = LIBCAPTION_ERROR;
        // fprintf(stderr, "LIBCAPTION_ERROR\n");
        return 0;
    }

    // consume upto MAX_NALU_SIZE bytes
    if (MAX_NALU_SIZE <= packet->size + size) {
        size = MAX_NALU_SIZE - packet->size;
    }

    sei_t sei;
    size_t header_size, scpos;
    packet->status = LIBCAPTION_OK;
    memcpy(&packet->data[packet->size], data, size);
    packet->size += size;

    while (packet->status == LIBCAPTION_OK && 0 < (scpos = find_start_code(&packet->data[0], packet->size))) {
        switch (mpeg_bitstream_packet_type(packet, stream_type)) {
        default:
            break;
        case H262_SEI_PACKET:
            header_size = 4;
            if (STREAM_TYPE_H262 == stream_type && scpos > header_size) {
                cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                packet->status = libcaption_status_update(packet->status, cea708_parse_h262(&packet->data[header_size], scpos - header_size, cea708));
                _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
            }
            break;
        case H264_SEI_PACKET:
        case H265_SEI_PACKET:
            header_size = STREAM_TYPE_H264 == stream_type ? 4 : STREAM_TYPE_H265 == stream_type ? 5 : 0;
            if (header_size && scpos > header_size) {
                packet->status = libcaption_status_update(packet->status, sei_parse(&sei, &packet->data[header_size], scpos - header_size, dts + cts));
                for (sei_message_t* msg = sei_message_head(&sei); msg; msg = sei_message_next(msg)) {
                    if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
                        cea708_t* cea708 = _mpeg_bitstream_cea708_emplace_back(packet, dts + cts);
                        packet->status = libcaption_status_update(packet->status, cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), cea708));
                        _mpeg_bitstream_cea708_sort_flush(packet, frame, dts);
                    }
                }
                sei_free(&sei);
            }
            break;
        }

        packet->size -= scpos;
        memmove(&packet->data[0], &packet->data[scpos], packet->size);
    }

    return size;
}